

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::CloneFileContent(string *source,string *destination)

{
  char *pcVar1;
  uint __fd;
  int __fd_00;
  int iVar2;
  int result;
  int out;
  int in;
  string *destination_local;
  string *source_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __fd = open(pcVar1,0);
  if ((int)__fd < 0) {
    source_local._7_1_ = false;
  }
  else {
    SystemTools::RemoveFile(destination);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    __fd_00 = open(pcVar1,0x241,0x180);
    if (__fd_00 < 0) {
      close(__fd);
      source_local._7_1_ = false;
    }
    else {
      iVar2 = ioctl(__fd_00,0x40049409,(ulong)__fd);
      close(__fd);
      close(__fd_00);
      if (iVar2 < 0) {
        source_local._7_1_ = false;
      }
      else {
        source_local._7_1_ = true;
      }
    }
  }
  return source_local._7_1_;
}

Assistant:

static bool CloneFileContent(const std::string& source,
                             const std::string& destination)
{
#if defined(__linux) && defined(FICLONE)
  int in = open(source.c_str(), O_RDONLY);
  if (in < 0) {
    return false;
  }

  SystemTools::RemoveFile(destination);

  int out =
    open(destination.c_str(), O_WRONLY | O_CREAT | O_TRUNC, S_IRUSR | S_IWUSR);
  if (out < 0) {
    close(in);
    return false;
  }

  int result = ioctl(out, FICLONE, in);
  close(in);
  close(out);

  if (result < 0) {
    return false;
  }

  return true;
#else
  (void)source;
  (void)destination;
  return false;
#endif
}